

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

group * clipp::operator_(group *__return_storage_ptr__,group *a,parameter *b)

{
  bool bVar1;
  __type _Var2;
  group local_1c0;
  group local_178;
  parameter local_130;
  
  if (a->scoped_ == false) {
    bVar1 = group::blocking(a);
    if ((((!bVar1) && (a->exclusive_ == false)) &&
        ((a->super_token<clipp::group>).repeatable_ == false)) && (a->joinable_ == false)) {
      if ((a->super_token<clipp::group>).doc_._M_string_length != 0) {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)b);
        if (!_Var2) goto LAB_001333bd;
      }
      std::
      vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
      ::emplace_back<clipp::parameter>(&a->children_,b);
      bVar1 = false;
      goto LAB_001333fb;
    }
  }
LAB_001333bd:
  group::group(&local_178,a);
  parameter::parameter(&local_130,b);
  a = &local_1c0;
  group::group<clipp::parameter>(a,&local_178,&local_130);
  local_1c0.scoped_ = false;
  bVar1 = true;
LAB_001333fb:
  group::group(__return_storage_ptr__,a);
  if (bVar1) {
    group::~group(&local_1c0);
    parameter::~parameter(&local_130);
    group::~group(&local_178);
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator , (group a, parameter b)
{
    return !a.scoped() && !a.blocking() && !a.exclusive() && !a.repeatable()
        && !a.joinable() && (a.doc().empty() || a.doc() == b.doc())
       ? a.push_back(std::move(b))
       : group{std::move(a), std::move(b)}.scoped(false);
}